

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O2

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,FieldInvocation *ptr)

{
  pointer ppVVar1;
  VariableSymbol *pVVar2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer ppVVar4;
  
  ppVVar4 = (this->curr_class->fields).
            super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (this->curr_class->fields).
            super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppVVar4 == ppVVar1) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(__return_storage_ptr__,"syntax error: can\'t find field ",ptr->name);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    pVVar2 = *ppVVar4;
    _Var3 = std::operator==(&(pVVar2->super_BaseSymbol).name,ptr->name);
    ppVVar4 = ppVVar4 + 1;
  } while (!_Var3);
  ptr->type = pVVar2->type;
  return;
}

Assistant:

void symbol_table_visitor::visit(FieldInvocation* ptr) {
    bool field_exists = false;
    for(auto field : curr_class->fields) {
        if (field->name == *ptr->name) {
            field_exists = true;
            ptr->type = field->type;
            break;
        }
    }
    if (!field_exists) {
        throw "syntax error: can't find field " + *ptr->name;
    }
    //name
}